

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

hwaddr x86_cpu_get_phys_page_attrs_debug_x86_64(CPUState *cs,vaddr addr,MemTxAttrs *attrs)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  uint64_t uVar5;
  TranslationBlock *pTVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint64_t unaff_R15;
  bool bVar11;
  
  *attrs = (MemTxAttrs)(*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x12 & 2);
  uVar9 = 0xffffffffffffffff;
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x80a) & 8) == 0) {
    uVar9 = (ulong)*(int *)(cs[1].tb_jmp_cache + 0x125);
  }
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x903) & 0x80) == 0) {
    unaff_R15 = uVar9 & addr;
    iVar7 = 0x1000;
    goto LAB_0051a20a;
  }
  if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
    uVar8 = addr >> 0x16 & 0x3ff;
    iVar7 = (int)uVar8;
    uVar3 = x86_ldl_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xfffffffffffff000) +
                                   uVar8 * 4 & uVar9);
    if ((uVar3 & 1) == 0) {
      bVar11 = false;
    }
    else {
      if (((char)uVar3 < '\0') && (((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) != 0)) {
        unaff_R15 = (ulong)(uVar3 & 0x1fe000) << 0x13 | (ulong)uVar3;
        iVar2 = 0x400000;
      }
      else {
        uVar3 = x86_ldl_phys_x86_64(cs,(ulong)((uint)uVar9 &
                                              ((uint)(addr >> 10) & 0xffc | uVar3 & 0xfffff000)));
        unaff_R15 = (uint64_t)uVar3;
        iVar7 = 0x1000;
        iVar2 = 0x1000;
        if ((uVar3 & 1) == 0) {
          bVar11 = false;
          goto LAB_0051a1ff;
        }
      }
      iVar7 = iVar2;
      unaff_R15 = unaff_R15 & uVar9;
      bVar11 = true;
    }
LAB_0051a1ff:
    if (!bVar11) {
      return 0xffffffffffffffff;
    }
    goto LAB_0051a20a;
  }
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x809) & 0x40) == 0) {
    uVar8 = addr >> 0x1e & 3;
    iVar7 = (int)uVar8;
    uVar5 = x86_ldq_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffffffffe0) +
                                   uVar8 * 8 & uVar9);
    if ((uVar5 & 1) == 0) {
      uVar10 = 1;
      unaff_R15 = uVar5;
    }
    else {
LAB_0051a162:
      unaff_R15 = x86_ldq_phys_x86_64(cs,((ulong)((uint)(addr >> 0x12) & 0xff8) |
                                         uVar5 & 0xffffffffff000) & uVar9);
      if ((unaff_R15 & 1) == 0) {
        uVar10 = 1;
        iVar7 = 0x40000000;
        unaff_R15 = uVar5;
      }
      else {
        iVar7 = 0x200000;
        if (-1 < (char)unaff_R15) {
          unaff_R15 = x86_ldq_phys_x86_64(cs,((ulong)((uint)(addr >> 9) & 0xff8) |
                                             unaff_R15 & 0xffffffffff000) & uVar9);
          iVar7 = 0x1000;
        }
        uVar10 = ~(uint)unaff_R15 & 1;
      }
    }
  }
  else {
    uVar4 = (uint)cs[1].tb_jmp_cache[0x124];
    uVar10 = 1;
    if (((long)addr >> (((uVar4 >> 0xc & 1) != 0) * '\t' + 0x2fU & 0x3f)) - 1U < 0xfffffffffffffffe)
    {
LAB_0051a157:
      bVar11 = false;
    }
    else {
      pTVar6 = cs[1].tb_jmp_cache[0x123];
      uVar1 = (uint)(addr >> 0x20);
      if (((uVar4 >> 0xc & 1) != 0) &&
         (pTVar6 = (TranslationBlock *)
                   x86_ldq_phys_x86_64(cs,((ulong)(uVar1 >> 0xd & 0xff8) |
                                          (ulong)pTVar6 & 0xfffffffffffff000) & uVar9),
         ((ulong)pTVar6 & 1) == 0)) goto LAB_0051a157;
      unaff_R15 = 0xffffffffff000;
      uVar5 = x86_ldq_phys_x86_64(cs,((ulong)(uVar1 >> 4 & 0xff8) | (ulong)pTVar6 & 0xffffffffff000)
                                     & uVar9);
      if ((uVar5 & 1) == 0) goto LAB_0051a157;
      unaff_R15 = x86_ldq_phys_x86_64(cs,((ulong)((uint)(addr >> 0x1b) & 0xff8) |
                                         uVar5 & 0xffffffffff000) & uVar9);
      if ((unaff_R15 & 1) == 0) {
        bVar11 = false;
      }
      else {
        bVar11 = (unaff_R15 & 0x80) == 0;
        uVar10 = 0;
      }
    }
    iVar7 = 0x40000000;
    uVar5 = unaff_R15;
    if (bVar11) goto LAB_0051a162;
  }
  if (uVar10 != 0) {
    return 0xffffffffffffffff;
  }
LAB_0051a20a:
  return (ulong)((uint)addr & iVar7 - 1U & 0xfffff000) | unaff_R15 & 0xffffffffff000 & (long)-iVar7;
}

Assistant:

hwaddr x86_cpu_get_phys_page_attrs_debug(CPUState *cs, vaddr addr,
                                         MemTxAttrs *attrs)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    target_ulong pde_addr, pte_addr;
    uint64_t pte;
    int32_t a20_mask;
    uint32_t page_offset;
    int page_size;

    *attrs = cpu_get_mem_attrs(env);

    a20_mask = x86_get_a20_mask(env);
    if (!(env->cr[0] & CR0_PG_MASK)) {
        pte = addr & a20_mask;
        page_size = 4096;
    } else if (env->cr[4] & CR4_PAE_MASK) {
        target_ulong pdpe_addr;
        uint64_t pde, pdpe;

#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            bool la57 = env->cr[4] & CR4_LA57_MASK;
            uint64_t pml5e_addr, pml5e;
            uint64_t pml4e_addr, pml4e;
            int32_t sext;

            /* test virtual address sign extension */
            sext = la57 ? (int64_t)addr >> 56 : (int64_t)addr >> 47;
            if (sext != 0 && sext != -1) {
                return -1;
            }

            if (la57) {
                pml5e_addr = ((env->cr[3] & ~0xfff) +
                        (((addr >> 48) & 0x1ff) << 3)) & a20_mask;
                pml5e = x86_ldq_phys(cs, pml5e_addr);
                if (!(pml5e & PG_PRESENT_MASK)) {
                    return -1;
                }
            } else {
                pml5e = env->cr[3];
            }

            pml4e_addr = ((pml5e & PG_ADDRESS_MASK) +
                    (((addr >> 39) & 0x1ff) << 3)) & a20_mask;
            pml4e = x86_ldq_phys(cs, pml4e_addr);
            if (!(pml4e & PG_PRESENT_MASK)) {
                return -1;
            }
            pdpe_addr = ((pml4e & PG_ADDRESS_MASK) +
                         (((addr >> 30) & 0x1ff) << 3)) & a20_mask;
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK)) {
                return -1;
            }
            if (pdpe & PG_PSE_MASK) {
                page_size = 1024 * 1024 * 1024;
                pte = pdpe;
                goto out;
            }

        } else
#endif
        {
            pdpe_addr = ((env->cr[3] & ~0x1f) + ((addr >> 27) & 0x18)) &
                a20_mask;
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK))
                return -1;
        }

        pde_addr = ((pdpe & PG_ADDRESS_MASK) +
                    (((addr >> 21) & 0x1ff) << 3)) & a20_mask;
        pde = x86_ldq_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK)) {
            return -1;
        }
        if (pde & PG_PSE_MASK) {
            /* 2 MB page */
            page_size = 2048 * 1024;
            pte = pde;
        } else {
            /* 4 KB page */
            pte_addr = ((pde & PG_ADDRESS_MASK) +
                        (((addr >> 12) & 0x1ff) << 3)) & a20_mask;
            page_size = 4096;
            pte = x86_ldq_phys(cs, pte_addr);
        }
        if (!(pte & PG_PRESENT_MASK)) {
            return -1;
        }
    } else {
        uint32_t pde;

        /* page directory entry */
        pde_addr = ((env->cr[3] & ~0xfff) + ((addr >> 20) & 0xffc)) & a20_mask;
        pde = x86_ldl_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK))
            return -1;
        if ((pde & PG_PSE_MASK) && (env->cr[4] & CR4_PSE_MASK)) {
            pte = pde | ((pde & 0x1fe000LL) << (32 - 13));
            page_size = 4096 * 1024;
        } else {
            /* page directory entry */
            pte_addr = ((pde & ~0xfff) + ((addr >> 10) & 0xffc)) & a20_mask;
            pte = x86_ldl_phys(cs, pte_addr);
            if (!(pte & PG_PRESENT_MASK)) {
                return -1;
            }
            page_size = 4096;
        }
        pte = pte & a20_mask;
    }

#ifdef TARGET_X86_64
out:
#endif
    pte &= PG_ADDRESS_MASK & ~(page_size - 1);
    page_offset = (addr & TARGET_PAGE_MASK) & (page_size - 1);
    return pte | page_offset;
}